

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O0

void skiwi::format_test_6(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  allocator<char> local_681;
  string local_680 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  allocator<char> local_639;
  string local_638 [32];
  string local_618 [32];
  anon_unknown_0 local_5f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  allocator<char> local_5b1;
  string local_5b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  allocator<char> local_569;
  string local_568 [32];
  string local_548 [32];
  anon_unknown_0 local_528 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  allocator<char> local_4e1;
  string local_4e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  allocator<char> local_499;
  string local_498 [32];
  string local_478 [32];
  anon_unknown_0 local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  allocator<char> local_411;
  string local_410 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  allocator<char> local_3c9;
  string local_3c8 [32];
  string local_3a8 [32];
  anon_unknown_0 local_388 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  allocator<char> local_341;
  string local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  allocator<char> local_2f9;
  string local_2f8 [32];
  string local_2d8 [32];
  anon_unknown_0 local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator<char> local_271;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  allocator<char> local_229;
  string local_228 [32];
  string local_208 [32];
  anon_unknown_0 local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator<char> local_1a1;
  string local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_159;
  string local_158 [32];
  string local_138 [32];
  anon_unknown_0 local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_79;
  string local_78 [32];
  string local_58 [32];
  anon_unknown_0 local_38 [8];
  string res;
  format_options ops;
  
  skiwi::format_options::format_options((format_options *)(res.field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_79);
  skiwi::format(local_58,(format_options *)local_78);
  anon_unknown_0::cleanup(local_38,(EVP_PKEY_CTX *)local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,
             "\n(define append\n  (lambda (l m)\n          (if (null? l)\n              m\n              (cons\n                (car l)\n                (append\n                  (cdr l) m)))))\n"
             ,&local_d1);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_b0,(EVP_PKEY_CTX *)local_d0);
  std::__cxx11::string::string((string *)&local_f8,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_b0,&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x92,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_159);
  skiwi::format(local_138,(format_options *)local_158);
  anon_unknown_0::cleanup(local_118,(EVP_PKEY_CTX *)local_138);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,
             "\n(define append (lambda\n                 (l m)\n                 (if (null? l)\n                     m\n                     (cons\n                       (car l)\n                       (append\n                         (cdr l) m)))))\n"
             ,&local_1a1);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_180,(EVP_PKEY_CTX *)local_1a0);
  std::__cxx11::string::string((string *)&local_1c8,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_180,&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x9f,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_228,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_229);
  skiwi::format(local_208,(format_options *)local_228);
  anon_unknown_0::cleanup(local_1e8,(EVP_PKEY_CTX *)local_208);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,
             "\n(define append (lambda (l m)\n                       (if (null? l)\n                           m (cons\n                               (car l)\n                               (append\n                                 (cdr l) m)))))\n"
             ,&local_271);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_250,(EVP_PKEY_CTX *)local_270);
  std::__cxx11::string::string((string *)&local_298,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_250,&local_298,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xaa,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_2f9);
  skiwi::format(local_2d8,(format_options *)local_2f8);
  anon_unknown_0::cleanup(local_2b8,(EVP_PKEY_CTX *)local_2d8);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_2b8);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_340,
             "\n(define append (lambda (l m)\n                       (if (null? l) m (cons\n                                         (car l)\n                                         (append\n                                           (cdr l) m)))))\n"
             ,&local_341);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_320,(EVP_PKEY_CTX *)local_340);
  std::__cxx11::string::string((string *)&local_368,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_320,&local_368,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xb4,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c8,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_3c9);
  skiwi::format(local_3a8,(format_options *)local_3c8);
  anon_unknown_0::cleanup(local_388,(EVP_PKEY_CTX *)local_3a8);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_388);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_410,
             "\n(define append (lambda (l m)\n                       (if (null? l) m (cons (car l)\n                                             (append\n                                               (cdr l) m)))))\n"
             ,&local_411);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_3f0,(EVP_PKEY_CTX *)local_410);
  std::__cxx11::string::string((string *)&local_438,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_3f0,&local_438,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xbd,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_499);
  skiwi::format(local_478,(format_options *)local_498);
  anon_unknown_0::cleanup(local_458,(EVP_PKEY_CTX *)local_478);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_458);
  std::__cxx11::string::~string((string *)local_458);
  std::__cxx11::string::~string(local_478);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e0,
             "\n(define append (lambda (l m) (if (null? l) m (cons (car l)\n                                                   (append (cdr l)\n                                                           m)))))\n"
             ,&local_4e1);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_4c0,(EVP_PKEY_CTX *)local_4e0);
  std::__cxx11::string::string((string *)&local_508,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_4c0,&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xc5,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_568,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_569);
  skiwi::format(local_548,(format_options *)local_568);
  anon_unknown_0::cleanup(local_528,(EVP_PKEY_CTX *)local_548);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_528);
  std::__cxx11::string::~string((string *)local_528);
  std::__cxx11::string::~string(local_548);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator(&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b0,
             "\n(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l)\n                                                                   m)))))\n"
             ,&local_5b1);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_590,(EVP_PKEY_CTX *)local_5b0);
  std::__cxx11::string::string((string *)&local_5d8,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_590,&local_5d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xcc,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_638,
             "(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))",
             &local_639);
  skiwi::format(local_618,(format_options *)local_638);
  anon_unknown_0::cleanup(local_5f8,(EVP_PKEY_CTX *)local_618);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_5f8);
  std::__cxx11::string::~string((string *)local_5f8);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_680,
             "\n(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l) m)))))\n"
             ,&local_681);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_660,(EVP_PKEY_CTX *)local_680);
  std::__cxx11::string::string((string *)&local_6a8,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_660,&local_6a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xd2,"void skiwi::format_test_6()");
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void format_test_6()
  {
  format_options ops;
  ops.max_width = 10;
  auto res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append
  (lambda (l m)
          (if (null? l)
              m
              (cons
                (car l)
                (append
                  (cdr l) m)))))
)"), res);

  ops.max_width = 20;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda
                 (l m)
                 (if (null? l)
                     m
                     (cons
                       (car l)
                       (append
                         (cdr l) m)))))
)"), res);

  ops.max_width = 30;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m)
                       (if (null? l)
                           m (cons
                               (car l)
                               (append
                                 (cdr l) m)))))
)"), res);

  ops.max_width = 40;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m)
                       (if (null? l) m (cons
                                         (car l)
                                         (append
                                           (cdr l) m)))))
)"), res);

  ops.max_width = 50;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m)
                       (if (null? l) m (cons (car l)
                                             (append
                                               (cdr l) m)))))
)"), res);

  ops.max_width = 60;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m) (if (null? l) m (cons (car l)
                                                   (append (cdr l)
                                                           m)))))
)"), res);

  ops.max_width = 70;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l)
                                                                   m)))))
)"), res);

  ops.max_width = 80;
  res = cleanup(format("(define append (lambda (l m)(if (null? l) m (cons(car l) (append(cdr l) m)))))", ops));
  TEST_EQ(cleanup(R"(
(define append (lambda (l m) (if (null? l) m (cons (car l) (append (cdr l) m)))))
)"), res);
  }